

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O1

SymOpnd * __thiscall IR::SymOpnd::CloneDefInternal(SymOpnd *this,Func *func)

{
  StackSym *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StackSym *sym;
  SymOpnd *pSVar4;
  
  if ((this->super_Opnd).m_kind != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x2cd,"(m_kind == OpndKindSym)","m_kind == OpndKindSym");
    if (!bVar2) goto LAB_0061a915;
    *puVar3 = 0;
  }
  this_00 = (StackSym *)this->m_sym;
  sym = this_00;
  if (((this_00->super_Sym).m_kind == SymKindStack) && ((this_00->field_0x18 & 1) != 0)) {
    if ((this_00->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar2) goto LAB_0061a915;
      *puVar3 = 0;
    }
    sym = StackSym::CloneDef(this_00,func);
    if ((sym->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar2) goto LAB_0061a915;
      *puVar3 = 0;
    }
    if (func->topFunc->m_cloner->clonedInstrGetOrigArgSlotSym != true) goto LAB_0061a8f3;
    if (((this_00->field_0x1a & 0x10) != 0) && (*(short *)&(this_00->super_Sym).field_0x16 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar2) goto LAB_0061a915;
      *puVar3 = 0;
    }
    if ((this_00->field_0x1a & 0x10) != 0) {
      if (sym == this_00) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                           ,0x2d6,"(newSym != oldSym)","newSym != oldSym");
        if (!bVar2) {
LAB_0061a915:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      this->m_sym = &sym->super_Sym;
      sym->field_5 = this_00->field_5;
      (this_00->field_5).m_instrDef = (Instr *)0x0;
      sym = this_00;
    }
  }
LAB_0061a8f3:
  pSVar4 = New(&sym->super_Sym,this->m_offset,(this->super_Opnd).m_type,func);
  return pSVar4;
}

Assistant:

SymOpnd *
SymOpnd::CloneDefInternal(Func *func)
{
    Assert(m_kind == OpndKindSym);
    Sym *sym = this->m_sym;

    if (sym->IsStackSym() && sym->AsStackSym()->m_isSingleDef)
    {
        StackSym * oldSym = sym->AsStackSym();
        StackSym * newSym = oldSym->CloneDef(func)->AsStackSym();
        if (func->GetCloner()->clonedInstrGetOrigArgSlotSym && oldSym->IsArgSlotSym())
        {
            Assert(newSym != oldSym);
            this->m_sym = newSym;
            newSym->m_instrDef = oldSym->m_instrDef;
            oldSym->m_instrDef = nullptr;
            sym = oldSym;
        }
        else
        {
            sym = newSym;
        }
    }

    SymOpnd * newOpnd = SymOpnd::New(sym, m_offset, m_type, func);

    return newOpnd;
}